

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int set_str_utf16be(archive_write *a,uchar *p,char *s,size_t l,uint16_t uf,vdc vdc)

{
  void *pvVar1;
  wchar_t wVar2;
  int iVar3;
  size_t n;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  undefined2 in_register_00000082;
  char *__s;
  ulong uVar7;
  ulong __n;
  
  __s = "";
  if (s != (char *)0x0) {
    __s = s;
  }
  uVar6 = l & 0xfffffffffffffffe;
  if (CONCAT22(in_register_00000082,uf) == 2) {
    pvVar1 = a->format_data;
    n = strlen(__s);
    wVar2 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x48),__s,n,
                              *(archive_string_conv **)((long)pvVar1 + 0x78));
    if ((wVar2 != L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    __n = *(ulong *)((long)pvVar1 + 0x50);
    if (uVar6 <= *(ulong *)((long)pvVar1 + 0x50)) {
      __n = uVar6;
    }
    memcpy(p,*(void **)((long)pvVar1 + 0x48),__n);
  }
  else {
    for (__n = 0; *(short *)(__s + __n) != 0; __n = __n + 2) {
    }
    if (uVar6 <= __n) {
      __n = uVar6;
    }
    memcpy(p,__s,__n);
  }
  for (uVar7 = 0; uVar7 < __n; uVar7 = uVar7 + 2) {
    iVar3 = joliet_allowed_char(p[uVar7],p[uVar7 + 1]);
    if (iVar3 == 0) {
      (p + uVar7)[0] = '\0';
      (p + uVar7)[1] = '_';
    }
  }
  for (lVar5 = 0; uVar6 - __n != lVar5; lVar5 = lVar5 + 2) {
    p[uVar7 + lVar5] = '\0';
    p[uVar7 + lVar5 + 1] = ' ';
  }
  if ((l & 1) != 0) {
    p[uVar7 + lVar5] = '\0';
  }
  return 0;
}

Assistant:

static int
set_str_utf16be(struct archive_write *a, unsigned char *p, const char *s,
    size_t l, uint16_t uf, enum vdc vdc)
{
	size_t size, i;
	int onepad;

	if (s == NULL)
		s = "";
	if (l & 0x01) {
		onepad = 1;
		l &= ~1;
	} else
		onepad = 0;
	if (vdc == VDC_UCS2) {
		struct iso9660 *iso9660 = a->format_data;
		if (archive_strncpy_l(&iso9660->utf16be, s, strlen(s),
		    iso9660->sconv_to_utf16be) != 0 && errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}
		size = iso9660->utf16be.length;
		if (size > l)
			size = l;
		memcpy(p, iso9660->utf16be.s, size);
	} else {
		const uint16_t *u16 = (const uint16_t *)s;

		size = 0;
		while (*u16++)
			size += 2;
		if (size > l)
			size = l;
		memcpy(p, s, size);
	}
	for (i = 0; i < size; i += 2, p += 2) {
		if (!joliet_allowed_char(p[0], p[1]))
			archive_be16enc(p, 0x005F);/* '_' */
	}
	l -= size;
	while (l > 0) {
		archive_be16enc(p, uf);
		p += 2;
		l -= 2;
	}
	if (onepad)
		*p = 0;
	return (ARCHIVE_OK);
}